

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_retry_request(connectdata *conn,char **url)

{
  Curl_easy *pCVar1;
  long lVar2;
  CURLcode CVar3;
  char *pcVar4;
  void *pvVar5;
  
  pCVar1 = conn->data;
  *url = (char *)0x0;
  if ((((((pCVar1->set).upload != true) || ((conn->handler->protocol & 0x40003) != 0)) &&
       ((pCVar1->req).bytecount + (pCVar1->req).headerbytecount == 0)) &&
      (((conn->bits).reuse == true &&
       (((pCVar1->set).opt_no_body != true || ((conn->handler->protocol & 3) != 0)))))) &&
     ((pCVar1->set).rtspreq != RTSPREQ_RECEIVE)) {
    Curl_infof(conn->data,"Connection died, retrying a fresh connect\n");
    pcVar4 = (*Curl_cstrdup)((conn->data->change).url);
    *url = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_conncontrol(conn,1);
    (conn->bits).retry = true;
    if ((conn->handler->protocol & 3) != 0) {
      pvVar5 = (pCVar1->req).protop;
      lVar2 = *(long *)((long)pvVar5 + 0x30);
      if (lVar2 != 0) {
        CVar3 = Curl_readrewind(conn);
        pvVar5 = (void *)(ulong)CVar3;
      }
      if (lVar2 != 0) {
        return (CURLcode)pvVar5;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_retry_request(struct connectdata *conn,
                            char **url)
{
  struct Curl_easy *data = conn->data;

  *url = NULL;

  /* if we're talking upload, we can't do the checks below, unless the protocol
     is HTTP as when uploading over HTTP we will still get a response */
  if(data->set.upload &&
     !(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)))
    return CURLE_OK;

  if((data->req.bytecount + data->req.headerbytecount == 0) &&
      conn->bits.reuse &&
      (!data->set.opt_no_body
        || (conn->handler->protocol & PROTO_FAMILY_HTTP)) &&
      (data->set.rtspreq != RTSPREQ_RECEIVE)) {
    /* We got no data, we attempted to re-use a connection. For HTTP this
       can be a retry so we try again regardless if we expected a body.
       For other protocols we only try again only if we expected a body.

       This might happen if the connection was left alive when we were
       done using it before, but that was closed when we wanted to read from
       it again. Bad luck. Retry the same request on a fresh connect! */
    infof(conn->data, "Connection died, retrying a fresh connect\n");
    *url = strdup(conn->data->change.url);
    if(!*url)
      return CURLE_OUT_OF_MEMORY;

    connclose(conn, "retry"); /* close this connection */
    conn->bits.retry = TRUE; /* mark this as a connection we're about
                                to retry. Marking it this way should
                                prevent i.e HTTP transfers to return
                                error just because nothing has been
                                transferred! */


    if(conn->handler->protocol&PROTO_FAMILY_HTTP) {
      struct HTTP *http = data->req.protop;
      if(http->writebytecount)
        return Curl_readrewind(conn);
    }
  }
  return CURLE_OK;
}